

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

void Wlc_NtkDupDfs_rec(Wlc_Ntk_t *pNew,Wlc_Ntk_t *p,int iObj,Vec_Int_t *vFanins)

{
  int iVar1;
  Wlc_Obj_t *p_00;
  int local_34;
  int iFanin;
  int i;
  Wlc_Obj_t *pObj;
  Vec_Int_t *vFanins_local;
  int iObj_local;
  Wlc_Ntk_t *p_local;
  Wlc_Ntk_t *pNew_local;
  
  if ((iObj != 0) && (iVar1 = Wlc_ObjCopy(p,iObj), iVar1 == 0)) {
    p_00 = Wlc_NtkObj(p,iObj);
    if ((undefined1  [24])((undefined1  [24])*p_00 & (undefined1  [24])0x3f) ==
        (undefined1  [24])0x5) {
      __assert_fail("pObj->Type != WLC_OBJ_FF",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcNtk.c"
                    ,0x3b7,"void Wlc_NtkDupDfs_rec(Wlc_Ntk_t *, Wlc_Ntk_t *, int, Vec_Int_t *)");
    }
    for (local_34 = 0; iVar1 = Wlc_ObjFaninNum(p_00), local_34 < iVar1; local_34 = local_34 + 1) {
      iVar1 = Wlc_ObjFaninId(p_00,local_34);
      Wlc_NtkDupDfs_rec(pNew,p,iVar1,vFanins);
    }
    Wlc_ObjDup(pNew,p,iObj,vFanins);
  }
  return;
}

Assistant:

void Wlc_NtkDupDfs_rec( Wlc_Ntk_t * pNew, Wlc_Ntk_t * p, int iObj, Vec_Int_t * vFanins )
{
    Wlc_Obj_t * pObj;
    int i, iFanin;
    if ( iObj == 0 )
        return;
    if ( Wlc_ObjCopy(p, iObj) )
        return;
    pObj = Wlc_NtkObj( p, iObj );
    //printf( "Visiting node %16s (ID %6d) of type %5s (type ID %2d)\n", Wlc_ObjName(p, iObj), iObj, Wlc_ObjTypeName(pObj), Wlc_NtkObj(p, iObj)->Type );
    assert( pObj->Type != WLC_OBJ_FF );
    Wlc_ObjForEachFanin( pObj, iFanin, i )
        Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
    Wlc_ObjDup( pNew, p, iObj, vFanins );
}